

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O1

void Qentem::Digit::formatStringNumberDefault<Qentem::StringStream<char16_t>>
               (StringStream<char16_t> *stream,SizeT started_at,SizeT32 precision,
               SizeT32 calculated_digits,SizeT32 fraction_length,bool is_positive_exp,bool round_up)

{
  char16_t cVar1;
  char16_t cVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char16_t *pcVar8;
  uint uVar9;
  int iVar10;
  char16_t *pcVar11;
  ulong uVar12;
  char16_t *pcVar13;
  SizeT SVar14;
  uint uVar15;
  uint uVar16;
  bool power_increased;
  bool local_41;
  uint local_40;
  SizeT local_3c;
  char16_t *local_38;
  
  uVar9 = stream->length_ - started_at;
  local_41 = false;
  pcVar8 = stream->storage_;
  uVar16 = 0;
  local_40 = started_at;
  if (precision < uVar9) {
    local_40 = stream->length_ + ~precision;
    local_3c = started_at;
    local_38 = stream->storage_;
    roundStringNumber<Qentem::StringStream<char16_t>>(stream,&local_40,&local_41,round_up);
    pcVar8 = local_38;
    started_at = local_3c;
    if (is_positive_exp) {
      iVar10 = 1;
      if (precision <= calculated_digits && calculated_digits - precision != 0) {
        iVar10 = calculated_digits - precision;
      }
      uVar4 = ((local_41 | 0xfffffffe) - fraction_length) + iVar10 + uVar9;
      uVar16 = 0;
      if (precision <= uVar4) {
        SVar14 = stream->length_;
        fraction_length = 0;
        uVar16 = uVar4;
        if (SVar14 != 0) {
          if (local_38 + local_40 < stream->storage_ + (SVar14 - 1)) {
            pcVar13 = local_38 + (ulong)local_40 + 1;
            do {
              uVar4 = local_40 + 1;
              if ((pcVar13[-1] != L'0') || (local_40 = uVar4, SVar14 == 0)) break;
              bVar3 = pcVar13 < stream->storage_ + (SVar14 - 1);
              pcVar13 = pcVar13 + 1;
            } while (bVar3);
          }
        }
      }
    }
    else {
      uVar16 = 0;
    }
  }
  uVar4 = uVar16;
  if (fraction_length != 0) {
    uVar15 = stream->length_;
    pcVar13 = stream->storage_;
    if (uVar15 != 0) {
      if (pcVar8 + local_40 < pcVar13 + (uVar15 - 1)) {
        pcVar11 = pcVar8 + (ulong)local_40 + 1;
        do {
          uVar5 = local_40 + 1;
          if ((pcVar11[-1] != L'0') || (local_40 = uVar5, (ulong)uVar15 == 0)) break;
          bVar3 = pcVar11 < pcVar13 + (uVar15 - 1);
          pcVar11 = pcVar11 + 1;
        } while (bVar3);
      }
    }
    iVar10 = uVar9 - fraction_length;
    if (uVar9 < fraction_length || iVar10 == 0) {
      uVar4 = fraction_length - uVar9;
      if (fraction_length < uVar9) {
        uVar4 = 0;
      }
      if (local_41 == false) {
        if (uVar4 < 4) {
          uVar15 = uVar15 + uVar4;
          if (stream->capacity_ < uVar15) {
            StringStream<char16_t>::expand(stream,uVar15);
          }
          Memory::Copy<unsigned_int>
                    (stream->storage_ + stream->length_,L"0000000000000000000",uVar4 * 2);
          stream->length_ = uVar15;
          SVar14 = uVar15 + 1;
          if (stream->capacity_ == uVar15) {
            StringStream<char16_t>::expand(stream,SVar14);
          }
          stream->storage_[stream->length_] = L'.';
          stream->length_ = SVar14;
          if (stream->capacity_ == SVar14) {
            StringStream<char16_t>::expand(stream,uVar15 + 2);
          }
          stream->storage_[stream->length_] = L'0';
          stream->length_ = uVar15 + 2;
          uVar4 = uVar16;
        }
        else {
          uVar4 = uVar4 + 1;
        }
      }
      else if (uVar4 < 5 && uVar9 < fraction_length) {
        local_38 = (char16_t *)CONCAT44(local_38._4_4_,uVar16);
        uVar16 = (uVar15 - 1) + uVar4;
        local_3c = started_at;
        if (stream->capacity_ < uVar16) {
          StringStream<char16_t>::expand(stream,uVar16);
        }
        Memory::Copy<unsigned_int>
                  (stream->storage_ + stream->length_,L"0000000000000000000",(uVar4 - 1) * 2);
        stream->length_ = uVar16;
        SVar14 = uVar15 + uVar4;
        if (stream->capacity_ == uVar16) {
          StringStream<char16_t>::expand(stream,SVar14);
        }
        stream->storage_[stream->length_] = L'.';
        stream->length_ = SVar14;
        if (stream->capacity_ == SVar14) {
          StringStream<char16_t>::expand(stream,SVar14 + 1);
        }
        stream->storage_[stream->length_] = L'0';
        stream->length_ = SVar14 + 1;
        started_at = local_3c;
        uVar4 = (SizeT)local_38;
      }
    }
    else {
      uVar16 = fraction_length + started_at;
      if (local_40 < uVar16) {
        if (uVar16 < uVar15) {
          pcVar8 = pcVar13 + (ulong)uVar16 + 1;
          cVar1 = pcVar8[-1];
          pcVar8[-1] = L'.';
          for (; pcVar8 < pcVar13 + uVar15; pcVar8 = pcVar8 + 1) {
            cVar2 = *pcVar8;
            *pcVar8 = cVar1;
            cVar1 = cVar2;
          }
          if (stream->capacity_ == uVar15) {
            StringStream<char16_t>::expand(stream,uVar15 + 1);
          }
          stream->storage_[stream->length_] = cVar1;
          stream->length_ = uVar15 + 1;
        }
      }
      else {
        if ((local_41 != true) &&
           (iVar10 = (local_40 - started_at) - (uVar9 - calculated_digits),
           local_40 - started_at < uVar9 - calculated_digits)) {
          iVar10 = 0;
        }
        if (iVar10 != 0) {
          uVar12 = (ulong)local_40;
          do {
            local_40 = (int)uVar12 - 1;
            uVar12 = (ulong)local_40;
            pcVar8[uVar12] = L'0';
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
      }
    }
  }
  uVar16 = stream->length_;
  uVar12 = (ulong)uVar16;
  if (started_at < uVar16) {
    pcVar8 = stream->storage_;
    uVar7 = (ulong)started_at;
    do {
      uVar6 = uVar7 + 1;
      cVar1 = pcVar8[uVar7];
      pcVar8[uVar7] = pcVar8[uVar12 - 1];
      pcVar8[uVar12 - 1] = cVar1;
      uVar12 = uVar12 - 1;
      uVar7 = uVar6;
    } while (uVar6 < uVar12);
  }
  if (local_40 - started_at <= uVar16) {
    stream->length_ = uVar16 - (local_40 - started_at);
  }
  if (uVar4 != 0) {
    uVar16 = stream->length_;
    if (started_at + 1 < uVar16) {
      pcVar13 = stream->storage_;
      pcVar8 = pcVar13 + (ulong)(started_at + 1) + 1;
      cVar1 = pcVar8[-1];
      pcVar8[-1] = L'.';
      for (; pcVar8 < pcVar13 + uVar16; pcVar8 = pcVar8 + 1) {
        cVar2 = *pcVar8;
        *pcVar8 = cVar1;
        cVar1 = cVar2;
      }
      if (stream->capacity_ == uVar16) {
        StringStream<char16_t>::expand(stream,uVar16 + 1);
      }
      stream->storage_[stream->length_] = cVar1;
      stream->length_ = uVar16 + 1;
    }
    insertPowerOfTen<Qentem::StringStream<char16_t>>(stream,uVar4,is_positive_exp);
  }
  return;
}

Assistant:

static void formatStringNumberDefault(Stream_T &stream, const SizeT started_at, const SizeT32 precision,
                                          const SizeT32 calculated_digits, SizeT32 fraction_length,
                                          const bool is_positive_exp, const bool round_up) {
        using Char_T                = typename Stream_T::CharType;
        Char_T     *storage         = stream.Storage();
        const SizeT number_length   = (stream.Length() - started_at);
        SizeT       index           = started_at;
        SizeT       power           = 0;
        bool        power_increased = false;
        /////////////////////////////////////////////////////
        if (number_length > precision) {
            --index;
            index += SizeT(number_length - precision);

            roundStringNumber(stream, index, power_increased, round_up);

            if (is_positive_exp) {
                const SizeT diff =
                    SizeT(((number_length - fraction_length) +
                           ((calculated_digits <= precision) ? 0 : (calculated_digits - (precision + SizeT{1})))) -
                          SizeT(!power_increased));

                if (diff >= precision) {
                    Char_T       *number = (storage + index);
                    const Char_T *last   = stream.Last();

                    while ((number < last) && (*number == DigitUtils::DigitChar::Zero)) {
                        ++number;
                        ++index;
                    }

                    power           = diff;
                    fraction_length = 0;
                }
            }
        }

        if (fraction_length != 0) {
            Char_T       *number        = (storage + index);
            const Char_T *last          = stream.Last();
            const SizeT   dot_index     = SizeT(started_at + fraction_length);
            const bool    fraction_only = (number_length <= fraction_length);

            while ((number < last) && (*number == DigitUtils::DigitChar::Zero)) {
                ++number;
                ++index;
            }

            if (fraction_only) {
                const SizeT diff = SizeT((fraction_length > number_length) ? (fraction_length - number_length) : 0);

                if (!power_increased) {
                    if (diff < SizeT{4}) {
                        insertZeros(stream, diff);
                        stream += DigitUtils::DigitChar::Dot;
                        stream += DigitUtils::DigitChar::Zero;
                    } else {
                        power = diff;
                        ++power;
                    }
                } else if ((diff != 0) && (diff < SizeT{5})) {
                    insertZeros(stream, (diff - SizeT{1}));
                    stream += DigitUtils::DigitChar::Dot;
                    stream += DigitUtils::DigitChar::Zero;
                } else {
                    power = diff;
                }
            } else if (index < dot_index) {
                stream.InsertAt(DigitUtils::DigitChar::Dot, dot_index);
            } else {
                SizeT zeros = 0;

                if (power_increased) {
                    zeros = SizeT(number_length - fraction_length);
                } else {
                    const SizeT rem    = (index - started_at);
                    const SizeT needed = SizeT(number_length - calculated_digits);

                    if (rem > needed) {
                        zeros = (rem - needed);
                    }
                }

                while (zeros != 0) {
                    --index;
                    storage[index] = DigitUtils::DigitChar::Zero;
                    --zeros;
                }
            }
        }

        stream.Reverse(started_at);
        stream.StepBack(index - started_at);

        if (power != 0) {
            stream.InsertAt(DigitUtils::DigitChar::Dot, (started_at + SizeT{1}));
            insertPowerOfTen(stream, power, is_positive_exp);
        }
    }